

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O1

FilePath *
testing::internal::FilePath::ConcatPaths
          (FilePath *__return_storage_ptr__,FilePath *directory,FilePath *relative_path)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  size_type sVar3;
  long *plVar4;
  ulong *puVar5;
  __string_type __str;
  FilePath dir;
  ulong *local_80;
  ulong local_70;
  long lStack_68;
  long *local_60;
  ulong local_58;
  long local_50 [2];
  FilePath local_40;
  
  if ((directory->pathname_)._M_string_length == 0) {
    (__return_storage_ptr__->pathname_)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->pathname_).field_2;
    pcVar2 = (relative_path->pathname_)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,
               pcVar2 + (relative_path->pathname_)._M_string_length);
  }
  else {
    RemoveTrailingPathSeparator(&local_40,directory);
    local_60 = local_50;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_60,local_40.pathname_._M_dataplus._M_p,
               local_40.pathname_._M_dataplus._M_p + local_40.pathname_._M_string_length);
    std::__cxx11::string::_M_replace_aux((ulong)&local_60,local_58,0,'\x01');
    plVar4 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_60,(ulong)(relative_path->pathname_)._M_dataplus._M_p
                               );
    puVar5 = (ulong *)(plVar4 + 2);
    if ((ulong *)*plVar4 == puVar5) {
      local_70 = *puVar5;
      lStack_68 = plVar4[3];
      local_80 = &local_70;
    }
    else {
      local_70 = *puVar5;
      local_80 = (ulong *)*plVar4;
    }
    sVar3 = plVar4[1];
    *plVar4 = (long)puVar5;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    paVar1 = &(__return_storage_ptr__->pathname_).field_2;
    (__return_storage_ptr__->pathname_)._M_dataplus._M_p = (pointer)paVar1;
    if (local_80 == &local_70) {
      paVar1->_M_allocated_capacity = local_70;
      *(long *)((long)&(__return_storage_ptr__->pathname_).field_2 + 8) = lStack_68;
    }
    else {
      (__return_storage_ptr__->pathname_)._M_dataplus._M_p = (pointer)local_80;
      (__return_storage_ptr__->pathname_).field_2._M_allocated_capacity = local_70;
    }
    (__return_storage_ptr__->pathname_)._M_string_length = sVar3;
    local_70 = local_70 & 0xffffffffffffff00;
    Normalize(__return_storage_ptr__);
    if (local_60 != local_50) {
      operator_delete(local_60,local_50[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40.pathname_._M_dataplus._M_p != &local_40.pathname_.field_2) {
      operator_delete(local_40.pathname_._M_dataplus._M_p,
                      local_40.pathname_.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

FilePath FilePath::ConcatPaths(const FilePath& directory,
                               const FilePath& relative_path) {
  if (directory.IsEmpty()) return relative_path;
  const FilePath dir(directory.RemoveTrailingPathSeparator());
  return FilePath(dir.string() + kPathSeparator + relative_path.string());
}